

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O1

void __thiscall chrono::ChLinkPulley::ChLinkPulley(ChLinkPulley *this,ChLinkPulley *other)

{
  undefined1 local_40 [24];
  double local_28;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock,&other->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkPulley_00b41c18;
  (this->belt_up1).m_data[0] = 0.0;
  (this->belt_up1).m_data[1] = 0.0;
  (this->belt_up1).m_data[2] = 0.0;
  (this->belt_up2).m_data[0] = 0.0;
  (this->belt_up2).m_data[1] = 0.0;
  (this->belt_up2).m_data[2] = 0.0;
  (this->belt_low1).m_data[0] = 0.0;
  (this->belt_low1).m_data[1] = 0.0;
  (this->belt_up2).m_data[1] = 0.0;
  (this->belt_up2).m_data[2] = 0.0;
  (this->belt_low1).m_data[0] = 0.0;
  (this->belt_low1).m_data[1] = 0.0;
  (this->belt_low1).m_data[2] = 0.0;
  (this->belt_low2).m_data[0] = 0.0;
  (this->belt_low2).m_data[1] = 0.0;
  (this->belt_low2).m_data[2] = 0.0;
  local_40._0_8_ = 1.0;
  local_40._8_16_ = ZEXT416(0) << 0x40;
  local_28 = 0.0;
  (this->local_shaft1)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  *(undefined1 (*) [16])(this->local_shaft1).coord.pos.m_data = local_40._8_16_;
  (this->local_shaft1).coord.pos.m_data[2] = 0.0;
  (this->local_shaft1).coord.rot.m_data[0] = 1.0;
  *(undefined1 (*) [16])((this->local_shaft1).coord.rot.m_data + 1) = local_40._8_16_;
  (this->local_shaft1).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_shaft1).Amatrix,(ChQuaternion<double> *)local_40);
  local_40._0_8_ = 1.0;
  local_40._8_16_ = ZEXT816(0);
  local_28 = 0.0;
  (this->local_shaft2)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->local_shaft2).coord.pos.m_data[0] = 0.0;
  (this->local_shaft2).coord.pos.m_data[1] = 0.0;
  (this->local_shaft2).coord.pos.m_data[2] = 0.0;
  (this->local_shaft2).coord.rot.m_data[0] = 1.0;
  (this->local_shaft2).coord.rot.m_data[1] = 0.0;
  (this->local_shaft2).coord.rot.m_data[2] = 0.0;
  (this->local_shaft2).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_shaft2).Amatrix,(ChQuaternion<double> *)local_40);
  this->tau = other->tau;
  this->phase = other->phase;
  this->a1 = other->a1;
  this->a2 = other->a2;
  this->checkphase = other->checkphase;
  this->r1 = other->r1;
  this->r2 = other->r2;
  if (other != this) {
    (this->belt_up1).m_data[0] = (other->belt_up1).m_data[0];
    (this->belt_up1).m_data[1] = (other->belt_up1).m_data[1];
    (this->belt_up1).m_data[2] = (other->belt_up1).m_data[2];
    (this->belt_up2).m_data[0] = (other->belt_up2).m_data[0];
    (this->belt_up2).m_data[1] = (other->belt_up2).m_data[1];
    (this->belt_up2).m_data[2] = (other->belt_up2).m_data[2];
    (this->belt_low1).m_data[0] = (other->belt_low1).m_data[0];
    (this->belt_low1).m_data[1] = (other->belt_low1).m_data[1];
    (this->belt_low1).m_data[2] = (other->belt_low1).m_data[2];
  }
  if (other != this) {
    (this->belt_low2).m_data[0] = (other->belt_low2).m_data[0];
    (this->belt_low2).m_data[1] = (other->belt_low2).m_data[1];
    (this->belt_low2).m_data[2] = (other->belt_low2).m_data[2];
  }
  ChFrame<double>::operator=(&this->local_shaft1,&other->local_shaft1);
  ChFrame<double>::operator=(&this->local_shaft2,&other->local_shaft2);
  this->shaft_dist = other->shaft_dist;
  return;
}

Assistant:

ChLinkPulley::ChLinkPulley(const ChLinkPulley& other) : ChLinkLockLock(other) {
    tau = other.tau;
    phase = other.phase;
    a1 = other.a1;
    a2 = other.a2;
    checkphase = other.checkphase;
    r1 = other.r1;
    r2 = other.r2;
    belt_up1 = other.belt_up1;
    belt_up2 = other.belt_up2;
    belt_low1 = other.belt_low1;
    belt_low2 = other.belt_low2;
    local_shaft1 = other.local_shaft1;
    local_shaft2 = other.local_shaft2;
    shaft_dist = other.shaft_dist;
}